

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAddCollateToken(Parse *pParse,Expr *pExpr,Token *pCollName)

{
  byte *pbVar1;
  Expr *pEVar2;
  
  if (pCollName->n != 0) {
    pEVar2 = sqlite3ExprAlloc(pParse->db,0x5c,pCollName,1);
    if (pEVar2 != (Expr *)0x0) {
      pEVar2->pLeft = pExpr;
      pbVar1 = (byte *)((long)&pEVar2->flags + 1);
      *pbVar1 = *pbVar1 | 1;
      pExpr = pEVar2;
    }
  }
  return pExpr;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateToken(Parse *pParse, Expr *pExpr, Token *pCollName){
  if( pCollName->n>0 ){
    Expr *pNew = sqlite3ExprAlloc(pParse->db, TK_COLLATE, pCollName, 1);
    if( pNew ){
      pNew->pLeft = pExpr;
      pNew->flags |= EP_Collate;
      pExpr = pNew;
    }
  }
  return pExpr;
}